

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

string * __thiscall pbrt::BilinearPatchMesh::ToString_abi_cxx11_(BilinearPatchMesh *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int *args_2;
  bool *args_1;
  long in_RSI;
  string *in_RDI;
  bool bVar1;
  string np;
  size_t in_stack_fffffffffffffe28;
  Normal3<float> *in_stack_fffffffffffffe30;
  span<const_pbrt::Normal3<float>_> *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  allocator<char> *in_stack_fffffffffffffe60;
  allocator<char> *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  string *fmt;
  allocator<char> local_151;
  span<const_int> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  undefined6 in_stack_fffffffffffffee0;
  byte bVar2;
  allocator<char> in_stack_fffffffffffffee7;
  string local_108 [38];
  byte local_e2;
  allocator<char> local_e1;
  span<const_pbrt::Normal3<float>_> local_e0;
  string local_d0 [38];
  byte local_aa;
  allocator<char> local_a9;
  span<const_pbrt::Point3<float>_> local_a8;
  string local_98 [32];
  span<const_int> local_78;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [48];
  
  fmt = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  std::allocator<char>::~allocator(&local_31);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 1);
  args_2 = (int *)(in_RSI + 4);
  args_1 = (bool *)(in_RSI + 8);
  if (*(long *)(in_RSI + 0x10) == 0) {
    std::__cxx11::string::string(local_68,local_30);
  }
  else {
    local_78 = pstd::MakeSpan<const_int>((int *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28)
    ;
    StringPrintf<pstd::span<int_const>>
              (in_stack_fffffffffffffe58,(span<const_int> *)in_stack_fffffffffffffe50);
  }
  local_aa = 0;
  if (*(long *)(in_RSI + 0x18) == 0) {
    in_stack_fffffffffffffe68 = &local_a9;
    std::allocator<char>::allocator();
    local_aa = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  }
  else {
    local_a8 = pstd::MakeSpan<const_pbrt::Point3<float>_>
                         ((Point3<float> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    StringPrintf<pstd::span<pbrt::Point3<float>const>>
              (in_stack_fffffffffffffe58,
               (span<const_pbrt::Point3<float>_> *)in_stack_fffffffffffffe50);
  }
  local_e2 = 0;
  if (*(long *)(in_RSI + 0x20) == 0) {
    in_stack_fffffffffffffe60 = &local_e1;
    std::allocator<char>::allocator();
    local_e2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  }
  else {
    local_e0 = pstd::MakeSpan<const_pbrt::Normal3<float>_>
                         (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    StringPrintf<pstd::span<pbrt::Normal3<float>const>>
              (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  }
  bVar2 = 0;
  if (*(long *)(in_RSI + 0x28) == 0) {
    in_stack_fffffffffffffe58 = &stack0xfffffffffffffee7;
    std::allocator<char>::allocator();
    bVar2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  }
  else {
    pstd::MakeSpan<const_pbrt::Point2<float>_>
              ((Point2<float> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    StringPrintf<pstd::span<pbrt::Point2<float>const>>
              (in_stack_fffffffffffffe58,
               (span<const_pbrt::Point2<float>_> *)in_stack_fffffffffffffe50);
  }
  bVar1 = *(long *)(in_RSI + 0x30) == 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  }
  else {
    local_150 = pstd::MakeSpan<const_int>
                          ((int *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    StringPrintf<pstd::span<int_const>>
              (in_stack_fffffffffffffe58,(span<const_int> *)in_stack_fffffffffffffe50);
  }
  StringPrintf<bool_const&,bool_const&,int_const&,int_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            ((char *)fmt,(bool *)in_RDI,args_1,args_2,(int *)this_00,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffec8,in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffee7,CONCAT16(bVar2,in_stack_fffffffffffffee0)));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
  if (bVar1) {
    std::allocator<char>::~allocator(&local_151);
  }
  std::__cxx11::string::~string(local_108);
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
  }
  std::__cxx11::string::~string(local_d0);
  if ((local_e2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_e1);
  }
  std::__cxx11::string::~string(local_98);
  if ((local_aa & 1) != 0) {
    std::allocator<char>::~allocator(&local_a9);
  }
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return fmt;
}

Assistant:

std::string BilinearPatchMesh::ToString() const {
    std::string np = "(nullptr)";
    return StringPrintf(
        "[ BilinearMatchMesh reverseOrientation: %s transformSwapsHandedness: "
        "%s "
        "nPatches: %d nVertices: %d vertexIndices: %s p: %s n: %s "
        "uv: %s faceIndices: %s ]",
        reverseOrientation, transformSwapsHandedness, nPatches, nVertices,
        vertexIndices ? StringPrintf("%s", pstd::MakeSpan(vertexIndices, 4 * nPatches))
                      : np,
        p ? StringPrintf("%s", pstd::MakeSpan(p, nVertices)) : nullptr,
        n ? StringPrintf("%s", pstd::MakeSpan(n, nVertices)) : nullptr,
        uv ? StringPrintf("%s", pstd::MakeSpan(uv, nVertices)) : nullptr,
        faceIndices ? StringPrintf("%s", pstd::MakeSpan(faceIndices, nPatches))
                    : nullptr);
}